

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentImpl.cpp
# Opt level: O0

DOMNodeList * __thiscall
xercesc_4_0::DOMDocumentImpl::getDeepNodeList
          (DOMDocumentImpl *this,DOMNode *rootNode,XMLCh *tagName)

{
  DOMDeepNodeListPool<xercesc_4_0::DOMDeepNodeListImpl,_xercesc_4_0::PtrHasher> *pDVar1;
  DOMDeepNodeListImpl *this_00;
  XMLSize_t elemId;
  XMLSize_t id;
  DOMDeepNodeListImpl *retList;
  XMLCh *tagName_local;
  DOMNode *rootNode_local;
  DOMDocumentImpl *this_local;
  
  if (this->fNodeListPool ==
      (DOMDeepNodeListPool<xercesc_4_0::DOMDeepNodeListImpl,_xercesc_4_0::PtrHasher> *)0x0) {
    pDVar1 = (DOMDeepNodeListPool<xercesc_4_0::DOMDeepNodeListImpl,_xercesc_4_0::PtrHasher> *)
             operator_new(0x40,this);
    DOMDeepNodeListPool<xercesc_4_0::DOMDeepNodeListImpl,_xercesc_4_0::PtrHasher>::
    DOMDeepNodeListPool(pDVar1,0x6d,false,0x80);
    this->fNodeListPool = pDVar1;
  }
  id = (XMLSize_t)
       DOMDeepNodeListPool<xercesc_4_0::DOMDeepNodeListImpl,_xercesc_4_0::PtrHasher>::getByKey
                 (this->fNodeListPool,rootNode,tagName,(XMLCh *)0x0);
  if ((DOMDeepNodeListImpl *)id == (DOMDeepNodeListImpl *)0x0) {
    pDVar1 = this->fNodeListPool;
    this_00 = (DOMDeepNodeListImpl *)operator_new(0x40,this);
    DOMDeepNodeListImpl::DOMDeepNodeListImpl(this_00,rootNode,tagName);
    elemId = DOMDeepNodeListPool<xercesc_4_0::DOMDeepNodeListImpl,_xercesc_4_0::PtrHasher>::put
                       (pDVar1,rootNode,tagName,(XMLCh *)0x0,this_00);
    id = (XMLSize_t)
         DOMDeepNodeListPool<xercesc_4_0::DOMDeepNodeListImpl,_xercesc_4_0::PtrHasher>::getById
                   (this->fNodeListPool,elemId);
  }
  return (DOMNodeList *)id;
}

Assistant:

DOMNodeList *DOMDocumentImpl::getDeepNodeList(const DOMNode *rootNode, const XMLCh *tagName)
{
    if(!fNodeListPool) {
        fNodeListPool = new (this) DOMDeepNodeListPool<DOMDeepNodeListImpl>(109, false);
    }

    DOMDeepNodeListImpl* retList = fNodeListPool->getByKey(rootNode, tagName, 0);
    if (!retList) {
        XMLSize_t id = fNodeListPool->put((void*) rootNode, (XMLCh*) tagName, 0, new (this) DOMDeepNodeListImpl(rootNode, tagName));
        retList = fNodeListPool->getById(id);
    }

    return retList;
}